

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.h
# Opt level: O1

void __thiscall
flow::diagnostics::Report::tokenError<std::__cxx11::string,unsigned_long,unsigned_long>
          (Report *this,SourceLocation *sloc,string *f,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          unsigned_long args_1,unsigned_long args_2)

{
  pointer pcVar1;
  basic_string_view<char> format_str;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  string local_2d0;
  SourceLocation local_2b0;
  pointer local_278;
  size_type sStack_270;
  unsigned_long local_268;
  unsigned_long local_258;
  undefined **local_248;
  undefined1 *local_240;
  long lStack_238;
  ulong local_230;
  undefined1 local_228 [504];
  
  local_2b0.filename._M_dataplus._M_p = (pointer)&local_2b0.filename.field_2;
  pcVar1 = (sloc->filename)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2b0,pcVar1,pcVar1 + (sloc->filename)._M_string_length);
  local_2b0.end.column = (sloc->end).column;
  local_2b0.end.offset = (sloc->end).offset;
  local_2b0.begin.line = (sloc->begin).line;
  local_2b0.begin.column = (sloc->begin).column;
  local_2b0._40_8_ = *(undefined8 *)&(sloc->begin).offset;
  format_str.data_ = (f->_M_dataplus)._M_p;
  format_str.size_ = f->_M_string_length;
  local_278 = (args->_M_dataplus)._M_p;
  sStack_270 = args->_M_string_length;
  lStack_238 = 0;
  local_248 = &PTR_grow_001aeda8;
  local_230 = 500;
  args_00.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_278;
  args_00.types_ = 0x55b;
  local_268 = args_1;
  local_258 = args_2;
  local_240 = local_228;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_248,format_str,args_00);
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2d0,local_240,local_240 + lStack_238);
  local_248 = &PTR_grow_001aeda8;
  if (local_240 != local_228) {
    operator_delete(local_240,local_230);
  }
  emplace_back(this,TokenError,&local_2b0,&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0.filename._M_dataplus._M_p != &local_2b0.filename.field_2) {
    operator_delete(local_2b0.filename._M_dataplus._M_p,
                    local_2b0.filename.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void tokenError(const SourceLocation& sloc, const std::string& f, Args... args) {
    emplace_back(Type::TokenError, sloc, fmt::format(f, std::move(args)...));
  }